

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_Test::testBody
          (TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *pMVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  UtestShell *pUVar4;
  char *pcVar5;
  SimpleString *this_00;
  char *pcVar6;
  undefined1 local_110 [96];
  undefined1 local_b0 [8];
  MockExpectedObjectDidntHappenFailure expectedFailure;
  undefined1 local_28 [8];
  MockExpectedCallsListForTest expectations;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,
             "differentScope::foobar");
  pMVar2 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)local_28,
                      (SimpleString *)
                      &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0x24])(pMVar2,1);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  pUVar4 = (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test;
  SimpleString::SimpleString((SimpleString *)(local_110 + 0x50),"differentScope::foobar");
  MockExpectedObjectDidntHappenFailure::MockExpectedObjectDidntHappenFailure
            ((MockExpectedObjectDidntHappenFailure *)local_b0,pUVar4,
             (SimpleString *)(local_110 + 0x50),(MockExpectedCallsList *)local_28);
  SimpleString::~SimpleString((SimpleString *)(local_110 + 0x50));
  SimpleString::SimpleString((SimpleString *)(local_110 + 0x40),"differentScope");
  pMVar3 = mock((SimpleString *)(local_110 + 0x40),(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)(local_110 + 0x30),"foobar");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_110 + 0x30);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x120))
            ((long *)CONCAT44(extraout_var,iVar1),1);
  SimpleString::~SimpleString((SimpleString *)(local_110 + 0x30));
  SimpleString::~SimpleString((SimpleString *)(local_110 + 0x40));
  SimpleString::SimpleString((SimpleString *)(local_110 + 0x20),"differentScope");
  pMVar3 = mock((SimpleString *)(local_110 + 0x20),(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)(local_110 + 0x10),"foobar");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,local_110 + 0x10);
  SimpleString::~SimpleString((SimpleString *)(local_110 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_110 + 0x20));
  MockSupportPlugin::postTestAction
            (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin,
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test,
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).result);
  pUVar4 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_110);
  pcVar5 = SimpleString::asCharString((SimpleString *)local_110);
  this_00 = StringBufferTestOutput::getOutput
                      (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).output);
  pcVar6 = SimpleString::asCharString(this_00);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,pcVar5,pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x58);
  SimpleString::~SimpleString((SimpleString *)local_110);
  CHECK_NO_MOCK_FAILURE_LOCATION
            ("/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x59);
  MockExpectedObjectDidntHappenFailure::~MockExpectedObjectDidntHappenFailure
            ((MockExpectedObjectDidntHappenFailure *)local_b0);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  return;
}

Assistant:

TEST(MockPlugin, checkExpectationsWorksAlsoWithHierachicalObjects)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("differentScope::foobar")->onObject((void*) 1);
    MockExpectedObjectDidntHappenFailure expectedFailure(test, "differentScope::foobar", expectations);

    mock("differentScope").expectOneCall("foobar").onObject((void*) 1);
    mock("differentScope").actualCall("foobar");

    plugin.postTestAction(*test, *result);

    STRCMP_CONTAINS(expectedFailure.getMessage().asCharString(), output.getOutput().asCharString());
    CHECK_NO_MOCK_FAILURE();
}